

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

any __thiscall
cs_impl::
cni_helper<void_(*)(cs_impl::any_&,_cs_impl::any_&),_void_(*)(cs_impl::any_&,_cs_impl::any_&)>::call
          (cni_helper<void_(*)(cs_impl::any_&,_cs_impl::any_&),_void_(*)(cs_impl::any_&,_cs_impl::any_&)>
           *this,vector *args)

{
  long lVar1;
  runtime_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = *in_RDX;
  if (in_RDX[1] - lVar1 != 0x10) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string(&local_a0,2);
    std::operator+(&local_60,"Wrong size of the arguments. Expected ",&local_a0);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
    local_c0._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_c0._M_dataplus._M_p == psVar3) {
      local_c0.field_2._M_allocated_capacity = *psVar3;
      local_c0.field_2._8_8_ = plVar2[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar3;
    }
    local_c0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::to_string(&local_80,in_RDX[1] - *in_RDX >> 3);
    std::operator+(&local_40,&local_c0,&local_80);
    cs::runtime_error::runtime_error(this_00,&local_40);
    __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)args[1].super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
              super__Vector_impl_data._M_start)(args,lVar1,lVar1 + 8);
    any::any<cs::pointer>((any *)this,(pointer *)&cs::null_pointer);
    return (any)(proxy *)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result);
			return cs::null_pointer;
		}